

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

EnumInfo * __thiscall
Catch::Detail::EnumValuesRegistry::registerEnum
          (EnumValuesRegistry *this,StringRef enumName,StringRef allValueNames,
          vector<int,_std::allocator<int>_> *values)

{
  EnumInfo *pEVar1;
  StringRef enumName_00;
  StringRef allValueNames_00;
  unique_ptr<Catch::Detail::EnumInfo> local_20;
  
  allValueNames_00.m_size = allValueNames.m_start;
  allValueNames_00.m_start = (char *)enumName.m_size;
  enumName_00.m_size = enumName.m_start;
  enumName_00.m_start = (char *)&local_20;
  makeEnumInfo(enumName_00,allValueNames_00,
               (vector<int,_std::allocator<int>_> *)allValueNames.m_size);
  std::
  vector<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>,std::allocator<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>>>
  ::emplace_back<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>>
            ((vector<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>,std::allocator<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>>>
              *)&this->m_enumInfos,&local_20);
  unique_ptr<Catch::Detail::EnumInfo>::~unique_ptr(&local_20);
  pEVar1 = (this->m_enumInfos).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>,_std::allocator<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr;
  if (pEVar1 != (EnumInfo *)0x0) {
    return pEVar1;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x37d,
                "T &Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>::operator*() [T = Catch::Detail::EnumInfo]"
               );
}

Assistant:

EnumInfo const& EnumValuesRegistry::registerEnum( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            m_enumInfos.push_back(makeEnumInfo(enumName, allValueNames, values));
            return *m_enumInfos.back();
        }